

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Token * __thiscall Parser::nextToken(Parser *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  allocator local_31;
  string local_30;
  Parser *local_10;
  Parser *this_local;
  
  this->mTokenIndex = this->mTokenIndex + 1;
  iVar1 = this->mTokenIndex;
  local_10 = this;
  sVar2 = std::vector<Token,_std::allocator<Token>_>::size(&this->mTokens);
  if (sVar2 <= (ulong)(long)iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"Reached end of tokens.",&local_31);
    parseError(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                     (&this->mTokens,(long)this->mTokenIndex);
  Token::operator=(&this->mCurrentToken,pvVar3);
  return &this->mCurrentToken;
}

Assistant:

Token& Parser::nextToken() {
	mTokenIndex++;

	if ((std::size_t)mTokenIndex >= mTokens.size()) {
		parseError("Reached end of tokens.");
	}

	mCurrentToken = mTokens[mTokenIndex];
	return mCurrentToken;
}